

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O3

bool ImNodes::RenderConnection(ImVec2 *input_pos,ImVec2 *output_pos,float thickness)

{
  ImVec2 *__src;
  bool bVar1;
  int iVar2;
  float *pfVar3;
  int iVar4;
  ImU32 col;
  ImDrawList *this;
  ImVec2 *pIVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 p3;
  ImVec2 p2;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  this = ImGui::GetWindowDrawList();
  pfVar3 = gCanvas;
  ImGui::GetStyle();
  fVar11 = *pfVar3;
  fVar9 = fVar11 * 100.0;
  local_38.x = input_pos->x - fVar9;
  local_38.y = input_pos->y;
  local_40.y = (*output_pos).y + 0.0;
  local_40.x = fVar9 + (*output_pos).x;
  iVar4 = (this->_Path).Size;
  if (iVar4 == (this->_Path).Capacity) {
    if (iVar4 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar4 / 2 + iVar4;
    }
    iVar2 = iVar4 + 1;
    if (iVar4 + 1 < iVar6) {
      iVar2 = iVar6;
    }
    pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar2 << 3);
    __src = (this->_Path).Data;
    if (__src != (ImVec2 *)0x0) {
      memcpy(pIVar5,__src,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar5;
    (this->_Path).Capacity = iVar2;
    iVar4 = (this->_Path).Size;
  }
  else {
    pIVar5 = (this->_Path).Data;
  }
  pIVar5[iVar4] = *input_pos;
  (this->_Path).Size = (this->_Path).Size + 1;
  ImDrawList::PathBezierCurveTo(this,&local_38,&local_40,output_pos,0);
  if ((this->_Path).Size < 2) {
    fVar9 = 3.4028235e+38;
  }
  else {
    fVar9 = 3.4028235e+38;
    lVar8 = 0;
    lVar7 = 0;
    do {
      local_48 = ImGui::GetMousePos();
      iVar4 = (this->_Path).Size;
      if ((iVar4 <= lVar7) || (lVar7 = lVar7 + 1, iVar4 <= lVar7)) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                      ,0x4d7,"T &ImVector<ImVec2>::operator[](int) [T = ImVec2]");
      }
      pIVar5 = (this->_Path).Data;
      fVar10 = GetDistanceToLineSquared
                         (&local_48,(ImVec2 *)((long)&pIVar5->x + lVar8),
                          (ImVec2 *)((long)&pIVar5[1].x + lVar8));
      if (fVar10 <= fVar9) {
        fVar9 = fVar10;
      }
      lVar8 = lVar8 + 8;
    } while (lVar7 < iVar4 + -1);
  }
  fVar11 = fVar11 * thickness;
  bVar1 = fVar9 <= fVar11 * fVar11;
  col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)(pfVar3 + (ulong)bVar1 * 4 + 0x13));
  ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,false,fVar11);
  (this->_Path).Size = 0;
  return bVar1;
}

Assistant:

bool RenderConnection(const ImVec2& input_pos, const ImVec2& output_pos, float thickness)
{
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    CanvasState* canvas = gCanvas;
    const ImGuiStyle& style = ImGui::GetStyle();

    thickness *= canvas->zoom;

    ImVec2 p2 = input_pos - ImVec2{100 * canvas->zoom, 0};
    ImVec2 p3 = output_pos + ImVec2{100 * canvas->zoom, 0};

    // Assemble segments for path
    draw_list->PathLineTo(input_pos);
    draw_list->PathBezierCurveTo(p2, p3, output_pos, 0);

    // Check each segment and determine if mouse is hovering curve that is to be drawn
    float min_square_distance = FLT_MAX;
    for (int i = 0; i < draw_list->_Path.size() - 1; i++)
    {
        min_square_distance = ImMin(min_square_distance,
            GetDistanceToLineSquared(ImGui::GetMousePos(), draw_list->_Path[i], draw_list->_Path[i + 1]));
    }

    // Draw curve, change when it is hovered
    bool is_close = min_square_distance <= thickness * thickness;
    draw_list->PathStroke(is_close ? canvas->colors[ColConnectionActive] : canvas->colors[ColConnection], false, thickness);
    return is_close;
}